

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SimpleRecurrentLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_simplerecurrent(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 400) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 400;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    SimpleRecurrentLayerParams::SimpleRecurrentLayerParams(this_00.simplerecurrent_);
    (this->layer_).simplerecurrent_ = (SimpleRecurrentLayerParams *)this_00;
  }
  return (SimpleRecurrentLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SimpleRecurrentLayerParams* NeuralNetworkLayer::mutable_simplerecurrent() {
  if (!has_simplerecurrent()) {
    clear_layer();
    set_has_simplerecurrent();
    layer_.simplerecurrent_ = new ::CoreML::Specification::SimpleRecurrentLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.simpleRecurrent)
  return layer_.simplerecurrent_;
}